

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

StringIntMap * __thiscall
glcts::ShaderStorageBufferLayoutBindingCase::ShaderStorageBufferLayoutBindingProgram::
getBindingPoints(StringIntMap *__return_storage_ptr__,ShaderStorageBufferLayoutBindingProgram *this,
                StringVector *args)

{
  glGetProgramResourceIndexFunc p_Var1;
  glGetProgramResourceivFunc p_Var2;
  GLint GVar3;
  bool bVar4;
  GLuint GVar5;
  GLenum GVar6;
  Functions *pFVar7;
  GLchar *pGVar8;
  reference __k;
  mapped_type_conflict *pmVar9;
  GLint local_54;
  GLenum GStack_50;
  bool hasNoError;
  GLint value;
  GLenum param;
  GLuint local_3c;
  iterator iStack_38;
  GLuint idx;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  iterator it;
  StringVector *args_local;
  ShaderStorageBufferLayoutBindingProgram *this_local;
  StringIntMap *bindingPoints;
  
  it._M_current._7_1_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(__return_storage_ptr__);
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(args);
  while( true ) {
    iStack_38 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(args);
    bVar4 = __gnu_cxx::operator!=(&local_30,&stack0xffffffffffffffc8);
    if (!bVar4) break;
    pFVar7 = LayoutBindingProgram::gl(&this->super_LayoutBindingProgram);
    p_Var1 = pFVar7->getProgramResourceIndex;
    GVar5 = LayoutBindingProgram::getProgram(&this->super_LayoutBindingProgram);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_30);
    pGVar8 = (GLchar *)std::__cxx11::string::c_str();
    local_3c = (*p_Var1)(GVar5,0x92e6,pGVar8);
    if (local_3c != 0xffffffff) {
      GStack_50 = 0x9302;
      local_54 = -1;
      pFVar7 = LayoutBindingProgram::gl(&this->super_LayoutBindingProgram);
      p_Var2 = pFVar7->getProgramResourceiv;
      GVar5 = LayoutBindingProgram::getProgram(&this->super_LayoutBindingProgram);
      (*p_Var2)(GVar5,0x92e6,local_3c,1,&stack0xffffffffffffffb0,1,(GLsizei *)0x0,&local_54);
      pFVar7 = LayoutBindingProgram::gl(&this->super_LayoutBindingProgram);
      GVar6 = (*pFVar7->getError)();
      GVar3 = local_54;
      if (GVar6 == 0) {
        __k = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_30);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](__return_storage_ptr__,__k);
        *pmVar9 = GVar3;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_30,0);
  }
  return __return_storage_ptr__;
}

Assistant:

StringIntMap getBindingPoints(StringVector args) const
		{
			StringIntMap bindingPoints;

			for (StringVector::iterator it = args.begin(); it != args.end(); it++)
			{
				glw::GLuint idx = gl().getProgramResourceIndex(getProgram(), GL_SHADER_STORAGE_BLOCK, (*it).c_str());
				if (idx != GL_INVALID_INDEX)
				{
					glw::GLenum param = GL_BUFFER_BINDING;
					glw::GLint  value = -1;
					gl().getProgramResourceiv(getProgram(), GL_SHADER_STORAGE_BLOCK, idx, 1, &param, 1, NULL, &value);
					bool hasNoError = (GL_NO_ERROR == gl().getError());
					if (hasNoError)
					{
						bindingPoints[*it] = value;
					}
				}
			}

			return bindingPoints;
		}